

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)8>_> * __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::createBufferAndBindMemory
          (Move<vk::Handle<(vk::HandleType)8>_> *__return_storage_ptr__,TimestampTestInstance *this,
          VkDeviceSize size,VkBufferUsageFlags usage,
          MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pAlloc)

{
  Allocation *pAVar1;
  Allocation *pAVar2;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pMVar3;
  VkResult result;
  int iVar4;
  DeviceInterface *vk;
  VkDevice device;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  Move<vk::Handle<(vk::HandleType)8>_> *extraout_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  deUint32 queueFamilyIndex;
  VkBufferCreateInfo vertexBufferParams;
  SimpleAllocator memAlloc;
  deUint32 local_48c;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_488;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_478;
  VkMemoryRequirements local_470;
  VkPhysicalDeviceMemoryProperties local_458;
  SimpleAllocator local_250;
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar5;
  
  local_478 = pAlloc;
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_48c = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk_00 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties(&local_458,vk_00,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator(&local_250,vk,device,&local_458);
  local_458.memoryTypeCount = 0xc;
  local_458.memoryTypes[0].heapIndex = 0;
  local_458.memoryTypes[1].propertyFlags = 0;
  local_458.memoryTypes[1].heapIndex = 0;
  local_458.memoryTypes[4].propertyFlags = 0;
  local_458.memoryTypes[4].heapIndex = 1;
  local_458.memoryTypes._44_8_ = &local_48c;
  local_458.memoryTypes._20_8_ = size;
  local_458.memoryTypes[3].heapIndex = usage;
  ::vk::createBuffer(__return_storage_ptr__,vk,device,(VkBufferCreateInfo *)&local_458,
                     (VkAllocationCallbacks *)0x0);
  ::vk::getBufferMemoryRequirements
            (&local_470,vk,device,
             (VkBuffer)
             (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
             m_internal);
  ::vk::SimpleAllocator::allocate(&local_488,&local_250,&local_470,(MemoryRequirement)0x1);
  result = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,
                      (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data
                      .object.m_internal,
                      ((local_488.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                       .ptr)->m_memory).m_internal,
                      (local_488.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_offset);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x356);
  pMVar3 = local_478;
  pAVar2 = local_488.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
           ptr;
  local_488.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  pAVar1 = (local_478->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data
           .ptr;
  pMVar5 = extraout_RAX;
  if (pAVar1 != pAVar2) {
    if (pAVar1 == (Allocation *)0x0) {
      (local_478->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr
           = pAVar2;
    }
    else {
      iVar4 = (*pAVar1->_vptr_Allocation[1])();
      pMVar5 = (Move<vk::Handle<(vk::HandleType)8>_> *)CONCAT44(extraout_var,iVar4);
      (pMVar3->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr =
           pAVar2;
      if (local_488.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
          != (Allocation *)0x0) {
        iVar4 = (*(local_488.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                   m_data.ptr)->_vptr_Allocation[1])();
        pMVar5 = (Move<vk::Handle<(vk::HandleType)8>_> *)CONCAT44(extraout_var_00,iVar4);
      }
    }
  }
  return pMVar5;
}

Assistant:

Move<VkBuffer> TimestampTestInstance::createBufferAndBindMemory(VkDeviceSize size, VkBufferUsageFlags usage, de::MovePtr<Allocation>* pAlloc)
{
	const DeviceInterface&      vk                  = m_context.getDeviceInterface();
	const VkDevice              vkDevice            = m_context.getDevice();
	const deUint32              queueFamilyIndex    = m_context.getUniversalQueueFamilyIndex();
	SimpleAllocator             memAlloc            (vk, vkDevice, getPhysicalDeviceMemoryProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice()));

	const VkBufferCreateInfo vertexBufferParams =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,       // VkStructureType      sType;
		DE_NULL,                                    // const void*          pNext;
		0u,                                         // VkBufferCreateFlags  flags;
		size,                                       // VkDeviceSize         size;
		usage,                                      // VkBufferUsageFlags   usage;
		VK_SHARING_MODE_EXCLUSIVE,                  // VkSharingMode        sharingMode;
		1u,                                         // deUint32             queueFamilyCount;
		&queueFamilyIndex                           // const deUint32*      pQueueFamilyIndices;
	};

	Move<VkBuffer> vertexBuffer = createBuffer(vk, vkDevice, &vertexBufferParams);
	de::MovePtr<Allocation> vertexBufferAlloc = memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *vertexBuffer), MemoryRequirement::HostVisible);

	VK_CHECK(vk.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset()));

	DE_ASSERT(pAlloc);
	*pAlloc = vertexBufferAlloc;

	return vertexBuffer;
}